

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashListEntry_GetValue(ktxHashListEntry *This,uint *pValueLen,void **ppValue)

{
  uint uVar1;
  ktx_error_code_e kVar2;
  void *pvVar3;
  
  kVar2 = KTX_INVALID_VALUE;
  if (ppValue != (void **)0x0 && pValueLen != (uint *)0x0) {
    uVar1 = This->valueLen;
    *pValueLen = uVar1;
    kVar2 = KTX_SUCCESS;
    if (uVar1 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = This->value;
    }
    *ppValue = pvVar3;
  }
  return kVar2;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetValue(ktxHashListEntry* This,
                          unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pValueLen = kv->valueLen;
        *ppValue = kv->valueLen > 0 ? kv->value : NULL;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}